

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O0

string * __thiscall
t_rs_generator::struct_to_invocation
          (string *__return_storage_ptr__,t_rs_generator *this,t_struct *tstruct,
          string *field_prefix)

{
  bool bVar1;
  members_type *__x;
  reference pptVar2;
  ostream *poVar3;
  string local_210;
  t_field *local_1f0;
  t_field *tfield;
  t_field **local_1e0;
  __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_1d8;
  iterator field_iter;
  undefined1 local_1c0 [8];
  vector<t_field_*,_std::allocator<t_field_*>_> fields;
  undefined1 local_1a0 [7];
  bool first_arg;
  ostringstream args;
  string *field_prefix_local;
  t_struct *tstruct_local;
  t_rs_generator *this_local;
  
  args._368_8_ = field_prefix;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  fields.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 1;
  __x = t_struct::get_sorted_members(tstruct);
  std::vector<t_field_*,_std::allocator<t_field_*>_>::vector
            ((vector<t_field_*,_std::allocator<t_field_*>_> *)local_1c0,__x);
  __gnu_cxx::__normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_1d8);
  local_1e0 = (t_field **)
              std::vector<t_field_*,_std::allocator<t_field_*>_>::begin
                        ((vector<t_field_*,_std::allocator<t_field_*>_> *)local_1c0);
  local_1d8._M_current = local_1e0;
  while( true ) {
    tfield = (t_field *)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                       ((vector<t_field_*,_std::allocator<t_field_*>_> *)local_1c0);
    bVar1 = __gnu_cxx::operator!=
                      (&local_1d8,
                       (__normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)&tfield);
    if (!bVar1) break;
    pptVar2 = __gnu_cxx::
              __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
              operator*(&local_1d8);
    local_1f0 = *pptVar2;
    if ((fields.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
      std::operator<<((ostream *)local_1a0,", ");
    }
    else {
      fields.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    }
    poVar3 = std::operator<<((ostream *)local_1a0,(string *)args._368_8_);
    rust_field_name_abi_cxx11_(&local_210,this,local_1f0);
    std::operator<<(poVar3,(string *)&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    __gnu_cxx::__normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_1d8);
  }
  std::__cxx11::ostringstream::str();
  std::vector<t_field_*,_std::allocator<t_field_*>_>::~vector
            ((vector<t_field_*,_std::allocator<t_field_*>_> *)local_1c0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return __return_storage_ptr__;
}

Assistant:

string t_rs_generator::struct_to_invocation(t_struct* tstruct, const string& field_prefix) {
  ostringstream args;

  bool first_arg = true;
  std::vector<t_field*> fields = tstruct->get_sorted_members();
  std::vector<t_field*>::iterator field_iter;
  for (field_iter = fields.begin(); field_iter != fields.end(); ++field_iter) {
    t_field* tfield = (*field_iter);

    if (first_arg) {
      first_arg = false;
    } else {
      args << ", ";
    }

    args << field_prefix << rust_field_name(tfield);
  }

  return args.str();
}